

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O0

void ncnn::crop_pack4_sse(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  __m128 _p;
  int x;
  int y;
  float *outptr;
  float *ptr;
  int right;
  int h;
  int w;
  int local_60;
  int local_5c;
  float *local_58;
  float *local_50;
  
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  iVar3 = in_RDI->w;
  iVar4 = in_RSI->w;
  local_50 = Mat::row(in_RDI,in_EDX);
  local_50 = local_50 + (in_ECX << 2);
  local_58 = Mat::operator_cast_to_float_(in_RSI);
  for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
      uVar5 = *(undefined8 *)(local_50 + 2);
      *(undefined8 *)local_58 = *(undefined8 *)local_50;
      *(undefined8 *)(local_58 + 2) = uVar5;
      local_50 = local_50 + 4;
      local_58 = local_58 + 4;
    }
    local_50 = local_50 + (iVar3 - iVar4) * 4;
  }
  return;
}

Assistant:

static void crop_pack4_sse(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 4;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }

        ptr += (left + right) * 4;
    }
}